

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Type actual;
  Type actual_1;
  Type local_3c;
  Type local_38;
  Type local_34;
  
  local_3c.enum_ = Any;
  RVar1 = PeekType(this,0,&local_3c);
  bVar4 = local_3c.enum_ != Any;
  bVar5 = local_3c.enum_ != expected3.enum_;
  local_38.enum_ = Any;
  RVar2 = PeekType(this,1,&local_38);
  bVar6 = local_38.enum_ != Any;
  bVar7 = local_38.enum_ != expected2.enum_;
  local_34.enum_ = Any;
  RVar3 = PeekType(this,2,&local_34);
  bVar4 = ((RVar3.enum_ == Error || bVar7 && (bVar6 && expected2.enum_ != Any)) ||
          ((RVar2.enum_ == Error || RVar1.enum_ == Error) ||
          bVar5 && (bVar4 && expected3.enum_ != Any))) ||
          local_34.enum_ != expected1.enum_ && (local_34.enum_ != Any && expected1.enum_ != Any);
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar4;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,RVar1,desc,expected1,expected2,expected3);
  RVar1 = DropTypes(this,3);
  return (Result)(uint)(bVar4 || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}